

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O2

QCommonStyle * __thiscall
QCommonStyle::standardPixmap
          (QCommonStyle *this,StandardPixmap sp,QStyleOption *option,QWidget *widget)

{
  long lVar1;
  undefined8 uVar2;
  qreal qVar3;
  char cVar4;
  bool bVar5;
  StandardPixmap standardIcon;
  Mode MVar6;
  undefined4 in_register_00000034;
  QWidget *in_R8;
  long in_FS_OFFSET;
  undefined4 uVar7;
  undefined4 uVar8;
  QImage local_88 [24];
  QImage local_70 [24];
  QIcon icon_1;
  QIcon icon;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(undefined8 *)(CONCAT44(in_register_00000034,sp) + 8);
  icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&icon);
  icon_1.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&icon_1);
  QIcon::operator=(&icon,&icon_1);
  QIcon::~QIcon(&icon_1);
  cVar4 = QIcon::isNull();
  if (cVar4 == '\0') {
    icon_1.d = (QIconPrivate *)0x1000000010;
    qVar3 = QStyleHelper::getDpr(in_R8);
    uVar7 = SUB84(qVar3,0);
    uVar8 = (undefined4)((ulong)qVar3 >> 0x20);
    MVar6 = (Mode)&icon;
LAB_003288b8:
    QIcon::pixmap((QSize *)this,(double)CONCAT44(uVar8,uVar7),MVar6,(State)&icon_1);
    goto LAB_003288c5;
  }
  standardIcon = (StandardPixmap)uVar2;
  QCommonStylePrivate::iconFromApplicationTheme
            ((QCommonStylePrivate *)&icon_1,standardIcon,
             (QStyleOption *)((ulong)option & 0xffffffff),widget);
  QIcon::operator=(&icon,&icon_1);
  QIcon::~QIcon(&icon_1);
  cVar4 = QIcon::isNull();
  if (cVar4 == '\0') {
LAB_00328891:
    icon_1.d = (QIconPrivate *)0x1000000010;
    qVar3 = QStyleHelper::getDpr(in_R8);
    uVar7 = SUB84(qVar3,0);
    uVar8 = (undefined4)((ulong)qVar3 >> 0x20);
    MVar6 = (Mode)&icon;
    goto LAB_003288b8;
  }
  QIcon::QIcon(&icon_1);
  QIcon::operator=(&icon,&icon_1);
  QIcon::~QIcon(&icon_1);
  cVar4 = QIcon::isNull();
  if (cVar4 == '\0') goto LAB_00328891;
  QCommonStylePrivate::iconFromResourceTheme
            ((QCommonStylePrivate *)&icon_1,standardIcon,
             (QStyleOption *)((ulong)option & 0xffffffff),widget);
  QIcon::operator=(&icon,&icon_1);
  QIcon::~QIcon(&icon_1);
  cVar4 = QIcon::isNull();
  if (cVar4 == '\0') goto LAB_00328891;
  switch((QStyleOption *)((ulong)option & 0xffffffff)) {
  case (QStyleOption *)0x0:
    titleBarMenuCachedPixmapFromXPM();
    goto LAB_003288c5;
  case (QStyleOption *)0x1:
    break;
  case (QStyleOption *)0x2:
    break;
  case (QStyleOption *)0x3:
    break;
  case (QStyleOption *)0x4:
    break;
  case (QStyleOption *)0x5:
    break;
  case (QStyleOption *)0x6:
    break;
  case (QStyleOption *)0x7:
    break;
  case (QStyleOption *)0x8:
    break;
  case (QStyleOption *)0x9:
    break;
  case (QStyleOption *)0xa:
    break;
  case (QStyleOption *)0xb:
    break;
  case (QStyleOption *)0xc:
    break;
  default:
    QPixmap::QPixmap((QPixmap *)this);
    goto LAB_003288c5;
  case (QStyleOption *)0x1b:
    bVar5 = QCommonStylePrivate::rtl((QStyleOption *)widget);
    if (bVar5) {
      icon_1.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage(local_88,tb_extension_arrow_h_xpm);
      QImage::convertToFormat(local_70,(Format)local_88,(ImageConversionFlags)0x5);
      QImage::flipped((QImage *)&icon_1,(QFlagsStorageHelper<Qt::Orientation,_4>)SUB84(local_70,0));
      QImage::~QImage(local_70);
      QImage::~QImage(local_88);
      QPixmap::fromImageInPlace(this,(QImage *)&icon_1,0);
      QImage::~QImage((QImage *)&icon_1);
      goto LAB_003288c5;
    }
    break;
  case (QStyleOption *)0x1c:
    break;
  case (QStyleOption *)0x1d:
    break;
  case (QStyleOption *)0x1e:
  }
  cachedPixmapFromXPM((char **)this);
LAB_003288c5:
  QIcon::~QIcon(&icon);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QCommonStyle::standardPixmap(StandardPixmap sp, const QStyleOption *option,
                                     const QWidget *widget) const
{
    Q_D(const QCommonStyle);
    QIcon icon;

    icon = d->iconFromWindowsTheme(sp, option, widget);
    if (!icon.isNull())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));

    icon = d->iconFromApplicationTheme(sp, option, widget);
    if (!icon.isNull())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));

    icon = d->iconFromMacTheme(sp, option, widget);
    if (!icon.isNull())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));

    icon = d->iconFromResourceTheme(sp, option, widget);
    if (!icon.isNull())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));

#ifndef QT_NO_IMAGEFORMAT_XPM
    switch (sp) {
    case QStyle::SP_ToolBarHorizontalExtensionButton:
        if (d->rtl(option)) {
            auto im = QImage(tb_extension_arrow_h_xpm).convertToFormat(QImage::Format_ARGB32).flipped(Qt::Horizontal);
            return QPixmap::fromImage(std::move(im));
        }
        return cachedPixmapFromXPM(tb_extension_arrow_h_xpm);
    case QStyle::SP_ToolBarVerticalExtensionButton:
        return cachedPixmapFromXPM(tb_extension_arrow_v_xpm);
    case QStyle::SP_FileDialogStart:
        return cachedPixmapFromXPM(filedialog_start_xpm);
    case QStyle::SP_FileDialogEnd:
        return cachedPixmapFromXPM(filedialog_end_xpm);
    case QStyle::SP_TitleBarMenuButton:
        return titleBarMenuCachedPixmapFromXPM();
    case QStyle::SP_TitleBarShadeButton:
        return cachedPixmapFromXPM(qt_shade_xpm);
    case QStyle::SP_TitleBarUnshadeButton:
        return cachedPixmapFromXPM(qt_unshade_xpm);
    case QStyle::SP_TitleBarNormalButton:
        return cachedPixmapFromXPM(qt_normalizeup_xpm);
    case QStyle::SP_TitleBarMinButton:
        return cachedPixmapFromXPM(qt_minimize_xpm);
    case QStyle::SP_TitleBarMaxButton:
        return cachedPixmapFromXPM(qt_maximize_xpm);
    case QStyle::SP_TitleBarCloseButton:
        return cachedPixmapFromXPM(qt_close_xpm);
    case QStyle::SP_TitleBarContextHelpButton:
        return cachedPixmapFromXPM(qt_help_xpm);
    case QStyle::SP_DockWidgetCloseButton:
        return cachedPixmapFromXPM(dock_widget_close_xpm);
    case QStyle::SP_MessageBoxInformation:
        return cachedPixmapFromXPM(information_xpm);
    case QStyle::SP_MessageBoxWarning:
        return cachedPixmapFromXPM(warning_xpm);
    case QStyle::SP_MessageBoxCritical:
        return cachedPixmapFromXPM(critical_xpm);
    case QStyle::SP_MessageBoxQuestion:
        return cachedPixmapFromXPM(question_xpm);
    default:
        break;
    }
#endif //QT_NO_IMAGEFORMAT_XPM

    return QPixmap();
}